

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::format<ChainstateRole,unsigned_long,unsigned_long,long,int,int,int>
               (ostream *out,char *fmt,ChainstateRole *args,unsigned_long *args_1,
               unsigned_long *args_2,long *args_3,int *args_4,int *args_5,int *args_6)

{
  long in_FS_OFFSET;
  FormatArg local_b8;
  unsigned_long *local_a0;
  code *local_98;
  code *local_90;
  unsigned_long *local_88;
  code *local_80;
  code *local_78;
  long *local_70;
  code *local_68;
  code *local_60;
  int *local_58;
  code *local_50;
  code *local_48;
  int *local_40;
  code *local_38;
  code *local_30;
  int *local_28;
  code *local_20;
  code *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.m_formatImpl = detail::FormatArg::formatImpl<ChainstateRole>;
  local_b8.m_toIntImpl = detail::FormatArg::toIntImpl<ChainstateRole>;
  local_98 = detail::FormatArg::formatImpl<unsigned_long>;
  local_90 = detail::FormatArg::toIntImpl<unsigned_long>;
  local_80 = detail::FormatArg::formatImpl<unsigned_long>;
  local_78 = detail::FormatArg::toIntImpl<unsigned_long>;
  local_68 = detail::FormatArg::formatImpl<long>;
  local_60 = detail::FormatArg::toIntImpl<long>;
  local_58 = args_4;
  local_50 = detail::FormatArg::formatImpl<int>;
  local_48 = detail::FormatArg::toIntImpl<int>;
  local_40 = args_5;
  local_38 = detail::FormatArg::formatImpl<int>;
  local_30 = detail::FormatArg::toIntImpl<int>;
  local_28 = args_6;
  local_20 = detail::FormatArg::formatImpl<int>;
  local_18 = detail::FormatArg::toIntImpl<int>;
  local_b8.m_value = args;
  local_a0 = args_1;
  local_88 = args_2;
  local_70 = args_3;
  detail::formatImpl(out,fmt,&local_b8,7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}